

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osMutex.cpp
# Opt level: O2

void __thiscall osMutex::Take(osMutex *this,char *file,int line)

{
  osThread *this_00;
  
  this_00 = osThread::GetCurrent();
  if (this_00 == (osThread *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)this);
  }
  else {
    osThread::SetState(this_00,PENDING_MUTEX,file,line,this);
    pthread_mutex_lock((pthread_mutex_t *)this);
    osThread::ClearState(this_00);
  }
  this->OwnerFile = file;
  this->OwnerLine = line;
  return;
}

Assistant:

void osMutex::Take(const char* file, int line)
{
#ifdef _WIN32
    DWORD rc = -1;

    if (Handle)
    {
        osThread* thread = osThread::GetCurrent();
        if (thread)
        {
            thread->SetState(osThread::THREAD_STATE::PENDING_MUTEX, file, line, this);
        }
        rc = WaitForSingleObject(Handle, INFINITE);
        if (thread)
        {
            thread->ClearState();
            OwnerThread = thread;
        }
        OwnerFile = file;
        OwnerLine = line;
    }
#elif __linux__
    osThread* thread = osThread::GetCurrent();
    if (thread)
    {
        thread->SetState(osThread::PENDING_MUTEX, file, line, this);
    }
    pthread_mutex_lock(&m_mutex);
    if (thread)
    {
        thread->ClearState();
    }
    OwnerFile = file;
    OwnerLine = line;
#endif
}